

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O2

bool __thiscall QToolBarPrivate::mousePressEvent(QToolBarPrivate *this,QMouseEvent *event)

{
  long lVar1;
  QWidget *this_00;
  char cVar2;
  bool bVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  QPointF QVar5;
  QPointF local_b0;
  QPoint local_a0;
  QPointF local_98;
  QStyleOptionToolBar opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionToolBar::QStyleOptionToolBar(&opt);
  (**(code **)(*(long *)this_00 + 0x1a0))(this_00,&opt);
  pQVar4 = QWidget::style(this_00);
  local_98 = (QPointF)(**(code **)(*(long *)pQVar4 + 0xc0))(pQVar4,0x34,&opt,this_00);
  QVar5 = QSinglePointEvent::position((QSinglePointEvent *)event);
  local_b0.yp = QVar5.yp;
  local_b0.xp = QVar5.xp;
  local_a0 = QPointF::toPoint(&local_b0);
  cVar2 = QRect::contains((QPoint *)&local_98,SUB81(&local_a0,0));
  if ((cVar2 != '\0') && (*(int *)(event + 0x40) == 1)) {
    bVar3 = QToolBarLayout::movable(this->layout);
    if (bVar3) {
      QVar5 = QSinglePointEvent::position((QSinglePointEvent *)event);
      local_98.yp = QVar5.yp;
      local_98.xp = QVar5.xp;
      local_b0.xp = (qreal)QPointF::toPoint(&local_98);
      initDrag(this,(QPoint *)&local_b0);
    }
  }
  QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)cVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QToolBarPrivate::mousePressEvent(QMouseEvent *event)
{
    Q_Q(QToolBar);
    QStyleOptionToolBar opt;
    q->initStyleOption(&opt);
    if (q->style()->subElementRect(QStyle::SE_ToolBarHandle, &opt, q).contains(event->position().toPoint()) == false) {
#ifdef Q_OS_MACOS
        // When using the unified toolbar on OS X, the user can click and
        // drag between toolbar contents to move the window. Make this work by
        // implementing the standard mouse-dragging code and then call
        // window->move() in mouseMoveEvent below.
        if (QMainWindow *mainWindow = qobject_cast<QMainWindow *>(parent)) {
            if (mainWindow->toolBarArea(q) == Qt::TopToolBarArea
                    && mainWindow->unifiedTitleAndToolBarOnMac()
                    && q->childAt(event->pos()) == 0) {
                macWindowDragging = true;
                macWindowDragPressPosition = event->pos();
                return true;
            }
        }
#endif
        return false;
    }

    if (event->button() != Qt::LeftButton)
        return true;

    if (!layout->movable())
        return true;

    initDrag(event->position().toPoint());
    return true;
}